

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::EqualTest<unsigned_char,short>(void)

{
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2f;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2e;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2d;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2c;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2b;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2a;
  int local_28 [6];
  
  local_28[5] = 3;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_2b,local_28 + 5);
  if (local_2b.m_int == '\x02') {
    local_28[4] = 4;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_2c,local_28 + 4);
    if (local_2c.m_int == '\x05') {
      local_28[3] = 6;
      SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2d,local_28 + 3);
      local_28[2] = 7;
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_2a,local_28 + 2);
      if ((ushort)local_2d.m_int == local_2a.m_int) {
        local_28[1] = 1;
        SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                  (&local_2e,local_28 + 1);
        if (local_2e.m_int != '\0') {
          local_28[0] = 0;
          SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                    (&local_2f,local_28);
          return local_2f.m_int == '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool EqualTest()
	{
		return
			(U)2 == SafeInt<T>(3) &&
			SafeInt<T>(4) == (U)5 &&
			SafeInt<T>(6) == SafeInt<U>(7) &&
			true == SafeInt<T>(1) &&
			false == SafeInt<T>(0);
	}